

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O3

basic_endpoint<boost::asio::ip::tcp> * __thiscall
libtorrent::detail::
read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
          (basic_endpoint<boost::asio::ip::tcp> *__return_storage_ptr__,detail *this,char **in)

{
  undefined1 uVar1;
  undefined1 uVar2;
  long lVar3;
  long lVar4;
  bytes_type *__range2;
  bytes_type bytes;
  address addr;
  undefined8 local_38;
  undefined8 uStack_30;
  address local_28;
  
  lVar3 = *(long *)this;
  lVar4 = 0;
  do {
    *(long *)this = lVar3 + 1 + lVar4;
    *(undefined1 *)((long)&local_38 + lVar4) = *(undefined1 *)(lVar3 + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  local_28.type_ = ipv6;
  local_28.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_28.ipv6_address_.addr_.__in6_u._0_8_ = local_38;
  local_28.ipv6_address_.addr_.__in6_u._8_8_ = uStack_30;
  local_28.ipv6_address_.scope_id_ = 0;
  uVar1 = *(undefined1 *)(lVar3 + 0x10);
  *(undefined1 **)this = (undefined1 *)(lVar3 + 0x11);
  uVar2 = *(undefined1 *)(lVar3 + 0x11);
  *(long *)this = lVar3 + 0x12;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (__return_storage_ptr__,&local_28,CONCAT11(uVar1,uVar2));
  return __return_storage_ptr__;
}

Assistant:

Endpoint read_v6_endpoint(InIt&& in)
		{
			address addr = read_v6_address(in);
			std::uint16_t port = read_uint16(in);
			return Endpoint(addr, port);
		}